

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

MeasurementSystem __thiscall QLocale::measurementSystem(QLocale *this)

{
  bool bVar1;
  uint uVar2;
  MeasurementSystem MVar3;
  QSystemLocale *pQVar4;
  QLocalePrivate *this_00;
  anon_union_24_3_e3d07ef4_for_data *paVar5;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d.ptr;
  if (this_00->m_data == &systemLocaleData) {
    paVar5 = &local_48;
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = systemLocale();
    local_68._16_8_ = 0;
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_50 = 2;
    (*pQVar4->_vptr_QSystemLocale[2])(paVar5,pQVar4,0x19);
    ::QVariant::~QVariant((QVariant *)&local_68);
    bVar1 = ::QVariant::isNull((QVariant *)&local_48);
    if (!bVar1) {
      uVar2 = ::QVariant::toInt((QVariant *)&local_48,(bool *)0x0);
      paVar5 = (anon_union_24_3_e3d07ef4_for_data *)(ulong)uVar2;
    }
    MVar3 = (MeasurementSystem)paVar5;
    ::QVariant::~QVariant((QVariant *)&local_48);
    if (!bVar1) goto LAB_002ddfb1;
    this_00 = (this->d).d.ptr;
  }
  MVar3 = QLocalePrivate::measurementSystem(this_00);
LAB_002ddfb1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return MVar3;
  }
  __stack_chk_fail();
}

Assistant:

QLocale::MeasurementSystem QLocale::measurementSystem() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        const auto res = systemLocale()->query(QSystemLocale::MeasurementSystem);
        if (!res.isNull())
            return MeasurementSystem(res.toInt());
    }
#endif

    return d->measurementSystem();
}